

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

uint32_t __thiscall basist::bitwise_decoder::get_bits(bitwise_decoder *this,uint32_t num_bits)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint in_ESI;
  long in_RDI;
  uint32_t bits;
  uint32_t bits_1;
  uint32_t bits0;
  uint32_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  if (in_ESI < 0x1a) {
    local_4 = peek_bits((bitwise_decoder *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                        in_stack_ffffffffffffffe4);
    *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) >> ((byte)in_ESI & 0x1f);
    *(uint *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) - in_ESI;
  }
  else {
    if (0x20 < in_ESI) {
      __assert_fail("num_bits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                    ,0x160,"uint32_t basist::bitwise_decoder::get_bits(uint32_t)");
    }
    uVar1 = peek_bits((bitwise_decoder *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
    *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) >> 0x19;
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + -0x19;
    iVar2 = in_ESI - 0x19;
    uVar3 = peek_bits((bitwise_decoder *)CONCAT44(iVar2,uVar1),in_stack_ffffffffffffffe4);
    *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) >> ((byte)iVar2 & 0x1f);
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) - iVar2;
    local_4 = uVar1 | uVar3 << 0x19;
  }
  return local_4;
}

Assistant:

uint32_t get_bits(uint32_t num_bits)
		{
			if (num_bits > 25)
			{
				assert(num_bits <= 32);

				const uint32_t bits0 = peek_bits(25);
				m_bit_buf >>= 25;
				m_bit_buf_size -= 25;
				num_bits -= 25;

				const uint32_t bits = peek_bits(num_bits);
				m_bit_buf >>= num_bits;
				m_bit_buf_size -= num_bits;

				return bits0 | (bits << 25);
			}

			const uint32_t bits = peek_bits(num_bits);

			m_bit_buf >>= num_bits;
			m_bit_buf_size -= num_bits;

			return bits;
		}